

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_palette.c
# Opt level: O0

prf_node_t * prf_vertex_palette_clone_f(prf_node_t *orig,prf_model_t *source,prf_model_t *target)

{
  int iVar1;
  uint8_t *puVar2;
  uint *puVar3;
  long in_RDX;
  long in_RSI;
  uint16_t *in_RDI;
  int count_1;
  int i_1;
  int count;
  int i;
  uint8_t *data;
  uint32_t length;
  prf_node_t *clone;
  int local_44;
  int local_3c;
  uint8_t *local_38;
  uint local_2c;
  undefined8 in_stack_ffffffffffffffd8;
  prf_node_t *local_8;
  
  if (*(short *)(in_RDX + 8) == 0) {
    local_8 = prf_node_create();
  }
  else {
    local_8 = (prf_node_t *)
              pool_malloc((pool_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30),
                          (int)in_stack_ffffffffffffffd8);
    prf_node_clear(local_8);
  }
  if (local_8 == (prf_node_t *)0x0) {
    prf_error(9,"memory allocation problem (returned NULL)");
    local_8 = (prf_node_t *)0x0;
  }
  else {
    local_8->opcode = *in_RDI;
    local_8->length = in_RDI[1];
    if (*(short *)(in_RDX + 8) != 0) {
      local_8->flags = local_8->flags | 0x100;
    }
    local_2c = **(uint **)(in_RDI + 4);
    if (*(long *)(in_RSI + 0x18) != 0) {
      iVar1 = prf_array_count((void *)0x111182);
      for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
        local_2c = *(int *)(*(long *)(*(long *)(in_RSI + 0x18) + (long)local_3c * 8) + 0xc) +
                   local_2c;
      }
    }
    if (*(short *)(in_RDX + 8) == 0) {
      puVar2 = (uint8_t *)malloc((ulong)local_2c);
      local_8->data = puVar2;
    }
    else {
      puVar2 = (uint8_t *)pool_malloc((pool_t)((ulong)local_8 >> 0x30),(int)local_8);
      local_8->data = puVar2;
    }
    if (local_8->data == (uint8_t *)0x0) {
      prf_error(9,"memory allocation problems (returned NULL)");
      if ((local_8->flags & 0x100) == 0) {
        prf_node_destroy((prf_node_t *)0x111247);
      }
      local_8 = (prf_node_t *)0x0;
    }
    else {
      puVar3 = (uint *)local_8->data;
      *puVar3 = local_2c;
      puVar3 = puVar3 + 2;
      iVar1 = **(int **)(in_RDI + 4);
      memcpy(puVar3,(void *)(*(long *)(in_RDI + 4) + 8),(ulong)(iVar1 - 8U));
      local_38 = (uint8_t *)((long)puVar3 + (ulong)(iVar1 - 8U));
      if (*(long *)(in_RSI + 0x18) != 0) {
        iVar1 = prf_array_count((void *)0x1112dc);
        for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
          memcpy(local_38,(void *)**(undefined8 **)(*(long *)(in_RSI + 0x18) + (long)local_44 * 8),
                 (ulong)*(uint *)(*(long *)(*(long *)(in_RSI + 0x18) + (long)local_44 * 8) + 0xc));
          local_38 = local_38 +
                     *(uint *)(*(long *)(*(long *)(in_RSI + 0x18) + (long)local_44 * 8) + 0xc);
        }
      }
      if (*(long *)(in_RDX + 0x18) != 0) {
        prf_debug(6,"vertex palette: clone inserted into model with extras");
      }
    }
  }
  return local_8;
}

Assistant:

static
prf_node_t *
prf_vertex_palette_clone_f(
    prf_node_t * orig,
    prf_model_t * source,
    prf_model_t * target )
{
    prf_node_t * clone;
    uint32_t length;
    uint8_t * data;

    assert( orig != NULL && source != NULL && target != NULL );

    if ( target->mempool_id == 0 ) {
        clone = prf_node_create();
    } else {
        clone = (prf_node_t *)pool_malloc( target->mempool_id, 
					   sizeof( prf_node_t ) );
        prf_node_clear( clone );
    }
    if ( clone == NULL ) {
        prf_error( 9, "memory allocation problem (returned NULL)" );
        return NULL;
    }
    clone->opcode = orig->opcode;
    clone->length = orig->length;
    if ( target->mempool_id != 0 )
        clone->flags |= PRF_NODE_MEMPOOLED;
    assert( orig->data != NULL );

    length = ((uint32_t *) orig->data)[0];
    if ( source->vertextras != NULL ) {
        int i, count;
        count = prf_array_count( source->vertextras );
        for ( i = 0; i < count; i++ )
            length += source->vertextras[i]->position;
    }
    if ( target->mempool_id == 0 ) 
        clone->data = (uint8_t *)malloc( length );
    else
        clone->data = (uint8_t *)pool_malloc( target->mempool_id, length );
    if ( clone->data == NULL ) {
        prf_error( 9, "memory allocation problems (returned NULL)" );
        if ( (clone->flags & PRF_NODE_MEMPOOLED) == 0 )
            prf_node_destroy( clone );
        return NULL;
    }
    data = clone->data;
    ((uint32_t *)data)[0] = length;
    data += 8;
    length = ((uint32_t *)orig->data)[0] - 8;
    memcpy( data, orig->data + 8, length );
    data += length;
    if ( source->vertextras != NULL ) {
        int i, count;
        count = prf_array_count( source->vertextras );
        for ( i = 0; i < count; i++ ) {
            memcpy( data, source->vertextras[i]->data,
                source->vertextras[i]->position );
            data += source->vertextras[i]->position;
        }
    }
    if ( target->vertextras != NULL )
        prf_debug( 6, "vertex palette: clone inserted into model with extras" );
    return clone;
}